

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void sockaddr_to_string(char *buf,size_t len,usa *usa)

{
  socklen_t __salen;
  
  *buf = '\0';
  if (usa != (usa *)0x0) {
    if ((usa->sa).sa_family == 2) {
      __salen = 0x10;
    }
    else {
      if ((usa->sa).sa_family != 10) {
        return;
      }
      __salen = 0x1c;
    }
    getnameinfo((sockaddr *)&usa->sa,__salen,buf,(socklen_t)len,(char *)0x0,0,1);
  }
  return;
}

Assistant:

static void
sockaddr_to_string(char *buf, size_t len, const union usa *usa)
{
	buf[0] = '\0';

	if (!usa) {
		return;
	}

	if (usa->sa.sa_family == AF_INET) {
		getnameinfo(&usa->sa,
		            sizeof(usa->sin),
		            buf,
		            (unsigned)len,
		            NULL,
		            0,
		            NI_NUMERICHOST);
	}
#if defined(USE_IPV6)
	else if (usa->sa.sa_family == AF_INET6) {
		getnameinfo(&usa->sa,
		            sizeof(usa->sin6),
		            buf,
		            (unsigned)len,
		            NULL,
		            0,
		            NI_NUMERICHOST);
	}
#endif
#if defined(USE_X_DOM_SOCKET)
	else if (usa->sa.sa_family == AF_UNIX) {
		/* TODO: Define a remote address for unix domain sockets.
		* This code will always return "localhost", identical to http+tcp:
		getnameinfo(&usa->sa,
		sizeof(usa->sun),
		buf,
		(unsigned)len,
		NULL,
		0,
		NI_NUMERICHOST);
		*/
		mg_strlcpy(buf, UNIX_DOMAIN_SOCKET_SERVER_NAME, len);
	}
#endif
}